

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.h
# Opt level: O3

Path * __thiscall kj::Path::operator=(Path *this,Path *param_1)

{
  String *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pSVar1 = (this->parts).ptr;
  if (pSVar1 != (String *)0x0) {
    sVar2 = (this->parts).size_;
    pAVar3 = (this->parts).disposer;
    (this->parts).ptr = (String *)0x0;
    (this->parts).size_ = 0;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pSVar1,0x18,sVar2,sVar2,ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  (this->parts).ptr = (param_1->parts).ptr;
  (this->parts).size_ = (param_1->parts).size_;
  (this->parts).disposer = (param_1->parts).disposer;
  (param_1->parts).ptr = (String *)0x0;
  (param_1->parts).size_ = 0;
  return this;
}

Assistant:

Path& operator=(Path&&) = default;